

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
deqp::gles3::Functional::getScalarSizes
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
          *symbols)

{
  uint uVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  pointer pSVar4;
  long lVar5;
  long lVar6;
  allocator_type local_21;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             ((long)(symbols->
                    super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(symbols->
                    super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,&local_21)
  ;
  pSVar4 = (symbols->
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar1 = (int)((ulong)((long)(symbols->
                              super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4) >> 3) *
          -0x49249249;
  pvVar3 = (vector<int,_std::allocator<int>_> *)(ulong)uVar1;
  if (0 < (int)uVar1) {
    lVar6 = 0x20;
    lVar5 = 0;
    do {
      iVar2 = glu::VarType::getScalarSize
                        ((VarType *)((long)&(pSVar4->name)._M_dataplus._M_p + lVar6));
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar5] = iVar2;
      lVar5 = lVar5 + 1;
      pSVar4 = (symbols->
               super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = (vector<int,_std::allocator<int>_> *)
               (long)((int)((ulong)((long)(symbols->
                                          super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4
                                   ) >> 3) * -0x49249249);
      lVar6 = lVar6 + 0x38;
    } while (lVar5 < (long)pvVar3);
  }
  return pvVar3;
}

Assistant:

static vector<int> getScalarSizes (const vector<Symbol>& symbols)
{
	vector<int> sizes(symbols.size());
	for (int ndx = 0; ndx < (int)symbols.size(); ++ndx)
		sizes[ndx] = symbols[ndx].varType.getScalarSize();
	return sizes;
}